

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_mixed_space_gradation(REF_DBL *metric,REF_GRID ref_grid,REF_DBL r,REF_DBL t)

{
  REF_DBL *m1;
  undefined8 *puVar1;
  undefined8 *puVar2;
  int node;
  REF_NODE ref_node;
  REF_NODE pRVar3;
  size_t __size;
  double __y;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  REF_STATUS RVar9;
  void *__ptr;
  long *plVar10;
  ulong uVar11;
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  REF_DBL *pRVar15;
  char *pcVar16;
  long lVar17;
  long lVar18;
  REF_EDGE ref_edge_00;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  REF_EDGE ref_edge;
  REF_DBL diag_system [12];
  REF_DBL limited [6];
  REF_DBL limit_metric [6];
  REF_EDGE local_120;
  REF_GRID local_118;
  long local_110;
  long local_108;
  long local_100;
  REF_DBL local_f8 [12];
  REF_DBL local_98 [6];
  REF_DBL local_68 [7];
  
  ref_node = ref_grid->node;
  dVar19 = log((double)(~-(ulong)(r < 1.0) & (ulong)r | -(ulong)(r < 1.0) & 0x3ff8000000000000));
  uVar8 = ref_edge_create(&local_120,ref_grid);
  if (uVar8 == 0) {
    pRVar3 = ref_grid->node;
    uVar8 = pRVar3->max;
    if ((int)uVar8 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x341,"ref_metric_mixed_space_gradation","malloc metric_orig of REF_DBL negative");
      return 1;
    }
    __size = (ulong)uVar8 * 0x30;
    local_118 = ref_grid;
    __ptr = malloc(__size);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x341,"ref_metric_mixed_space_gradation","malloc metric_orig of REF_DBL NULL");
      return 2;
    }
    if ((ulong)uVar8 != 0) {
      plVar10 = pRVar3->global;
      uVar11 = 0;
      do {
        if (-1 < *plVar10) {
          uVar13 = uVar11 & 0x7fffffff0;
          uVar12 = *(undefined8 *)((long)metric + uVar13);
          uVar4 = ((undefined8 *)((long)metric + uVar13))[1];
          puVar1 = (undefined8 *)((long)metric + uVar13 + 0x10);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          puVar1 = (undefined8 *)((long)metric + uVar13 + 0x20);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)((long)__ptr + uVar13 + 0x20);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          puVar1 = (undefined8 *)((long)__ptr + uVar13 + 0x10);
          *puVar1 = uVar5;
          puVar1[1] = uVar6;
          *(undefined8 *)((long)__ptr + uVar13) = uVar12;
          ((undefined8 *)((long)__ptr + uVar13))[1] = uVar4;
        }
        uVar11 = uVar11 + 0x30;
        plVar10 = plVar10 + 1;
      } while (__size != uVar11);
    }
    ref_edge_00 = local_120;
    if (0 < local_120->n) {
      __y = (double)(-(ulong)(t < 0.0) & 0x3fc0000000000000 |
                    ~-(ulong)(t < 0.0) &
                    (~-(ulong)(t < 1.0) & (ulong)t | -(ulong)(t < 1.0) & 0x3fc0000000000000));
      lVar18 = 0;
      do {
        node = local_120->e2n[lVar18 * 2];
        lVar14 = (long)node;
        lVar17 = (long)local_120->e2n[lVar18 * 2 + 1];
        pRVar15 = ref_node->real;
        dVar26 = pRVar15[lVar17 * 0xf] - pRVar15[lVar14 * 0xf];
        dVar25 = pRVar15[lVar17 * 0xf + 1] - pRVar15[lVar14 * 0xf + 1];
        dVar24 = pRVar15[lVar17 * 0xf + 2] - pRVar15[lVar14 * 0xf + 2];
        dVar20 = *(double *)((long)__ptr + lVar17 * 0x30 + 8);
        dVar21 = *(double *)((long)__ptr + lVar17 * 0x30 + 0x10);
        dVar22 = *(double *)((long)__ptr + lVar17 * 0x30 + 0x20);
        dVar20 = (*(double *)((long)__ptr + lVar17 * 0x30 + 0x28) * dVar24 +
                 dVar21 * dVar26 + dVar22 * dVar25) * dVar24 +
                 (dVar21 * dVar24 +
                 *(double *)((long)__ptr + lVar17 * 0x30) * dVar26 + dVar25 * dVar20) * dVar26 +
                 (dVar22 * dVar24 +
                 dVar20 * dVar26 + *(double *)((long)__ptr + lVar17 * 0x30 + 0x18) * dVar25) *
                 dVar25;
        local_100 = lVar18;
        if (dVar20 < 0.0) {
          dVar20 = sqrt(dVar20);
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        pRVar15 = (REF_DBL *)((long)__ptr + lVar17 * 0x30);
        local_110 = lVar17 * 6;
        uVar8 = ref_matrix_diag_m(pRVar15,local_f8);
        if (uVar8 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x358,"ref_metric_mixed_space_gradation",(ulong)uVar8,"decomp");
LAB_001e358a:
          ref_metric_show(pRVar15);
          return uVar8;
        }
        dVar21 = SQRT(dVar24 * dVar24 + dVar26 * dVar26 + dVar25 * dVar25);
        lVar18 = 0;
        local_108 = lVar17;
        do {
          dVar22 = local_f8[lVar18];
          if (dVar22 < 0.0) {
            dVar22 = sqrt(dVar22);
          }
          else {
            dVar22 = SQRT(dVar22);
          }
          dVar22 = pow(dVar22 * dVar21 * dVar19 + 1.0,__y);
          dVar23 = pow(dVar19 * dVar20 + 1.0,1.0 - __y);
          dVar22 = pow(dVar23 * dVar22,-2.0);
          local_f8[lVar18] = dVar22 * local_f8[lVar18];
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
        uVar8 = ref_matrix_form_m(local_f8,local_68);
        if (uVar8 != 0) {
          pcVar16 = "reform limit";
          uVar12 = 0x35f;
          goto LAB_001e2e56;
        }
        m1 = (REF_DBL *)((long)__ptr + lVar14 * 0x30);
        RVar9 = ref_matrix_intersect(m1,local_68,local_98);
        if (RVar9 == 0) {
          uVar8 = ref_matrix_intersect(metric + lVar14 * 6,local_98,metric + lVar14 * 6);
          if (uVar8 != 0) {
            pcVar16 = "update m0";
            uVar12 = 0x365;
            goto LAB_001e2e56;
          }
        }
        else {
          ref_node_location(ref_node,node);
          printf("dist %24.15e ratio %24.15e\n",dVar21,dVar20);
          puts("RECOVER ref_metric_mixed_space_gradation");
        }
        dVar20 = (m1[5] * dVar24 + m1[2] * dVar26 + dVar25 * m1[4]) * dVar24 +
                 (m1[2] * dVar24 + *m1 * dVar26 + dVar25 * m1[1]) * dVar26 +
                 (m1[4] * dVar24 + m1[1] * dVar26 + m1[3] * dVar25) * dVar25;
        if (dVar20 < 0.0) {
          dVar20 = sqrt(dVar20);
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        uVar8 = ref_matrix_diag_m(m1,local_f8);
        if (uVar8 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x36f,"ref_metric_mixed_space_gradation",(ulong)uVar8,"decomp");
          pRVar15 = m1;
          goto LAB_001e358a;
        }
        lVar18 = 0;
        do {
          dVar22 = local_f8[lVar18];
          if (dVar22 < 0.0) {
            dVar22 = sqrt(dVar22);
          }
          else {
            dVar22 = SQRT(dVar22);
          }
          dVar22 = pow(dVar22 * dVar21 * dVar19 + 1.0,__y);
          dVar24 = pow(dVar19 * dVar20 + 1.0,1.0 - __y);
          dVar22 = pow(dVar24 * dVar22,-2.0);
          local_f8[lVar18] = dVar22 * local_f8[lVar18];
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
        uVar8 = ref_matrix_form_m(local_f8,local_68);
        if (uVar8 != 0) {
          pcVar16 = "reform limit";
          uVar12 = 0x376;
          goto LAB_001e2e56;
        }
        RVar9 = ref_matrix_intersect(pRVar15,local_68,local_98);
        if (RVar9 == 0) {
          uVar8 = ref_matrix_intersect(metric + local_110,local_98,metric + local_110);
          if (uVar8 != 0) {
            pcVar16 = "update m1";
            uVar12 = 0x37c;
            goto LAB_001e2e56;
          }
        }
        else {
          ref_node_location(ref_node,(REF_INT)local_108);
          printf("dist %24.15e ratio %24.15e\n",dVar21,dVar20);
          puts("RECOVER ref_metric_mixed_space_gradation");
        }
        lVar18 = local_100 + 1;
        ref_edge_00 = local_120;
      } while (lVar18 < local_120->n);
    }
    free(__ptr);
    ref_edge_free(ref_edge_00);
    uVar8 = ref_node_ghost_dbl(local_118->node,metric,6);
    if (uVar8 == 0) {
      return 0;
    }
    pcVar16 = "update ghosts";
    uVar12 = 0x388;
  }
  else {
    pcVar16 = "orig edges";
    uVar12 = 0x33f;
  }
LAB_001e2e56:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar12,
         "ref_metric_mixed_space_gradation",(ulong)uVar8,pcVar16);
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_metric_mixed_space_gradation(REF_DBL *metric,
                                                    REF_GRID ref_grid,
                                                    REF_DBL r, REF_DBL t) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *metric_orig;
  REF_DBL dist, ratio, enlarge, log_r;
  REF_DBL direction[3];
  REF_DBL limit_metric[6], limited[6];
  REF_INT node, i;
  REF_INT edge, node0, node1;
  REF_DBL diag_system[12];
  REF_DBL metric_space, phys_space;

  if (r < 1.0) r = 1.5;
  if (t < 0.0 || 1.0 > t) t = 1.0 / 8.0;

  log_r = log(r);

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc(metric_orig, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 6; i++) metric_orig[i + 6 * node] = metric[i + 6 * node];
  }

  /* F. Alauzet doi:10.1016/j.finel.2009.06.028
   * 6.2.1. Mixed-space homogeneous gradation */

  each_ref_edge(ref_edge, edge) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    direction[0] =
        (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
    direction[1] =
        (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
    direction[2] =
        (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));
    dist = sqrt(ref_math_dot(direction, direction));

    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node1]), direction);

    RSB(ref_matrix_diag_m(&(metric_orig[6 * node1]), diag_system), "decomp",
        { ref_metric_show(&(metric_orig[6 * node1])); });
    for (i = 0; i < 3; i++) {
      metric_space = 1.0 + log_r * ratio;
      phys_space = 1.0 + sqrt(ref_matrix_eig(diag_system, i)) * dist * log_r;
      enlarge = pow(pow(phys_space, t) * pow(metric_space, 1.0 - t), -2.0);
      ref_matrix_eig(diag_system, i) *= enlarge;
    }
    RSS(ref_matrix_form_m(diag_system, limit_metric), "reform limit");

    if (REF_SUCCESS == ref_matrix_intersect(&(metric_orig[6 * node0]),
                                            limit_metric, limited)) {
      RSS(ref_matrix_intersect(&(metric[6 * node0]), limited,
                               &(metric[6 * node0])),
          "update m0");
    } else {
      ref_node_location(ref_node, node0);
      printf("dist %24.15e ratio %24.15e\n", dist, ratio);
      printf("RECOVER ref_metric_mixed_space_gradation\n");
    }

    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node0]), direction);

    RSB(ref_matrix_diag_m(&(metric_orig[6 * node0]), diag_system), "decomp",
        { ref_metric_show(&(metric_orig[6 * node0])); });
    for (i = 0; i < 3; i++) {
      metric_space = 1.0 + log_r * ratio;
      phys_space = 1.0 + sqrt(ref_matrix_eig(diag_system, i)) * dist * log_r;
      enlarge = pow(pow(phys_space, t) * pow(metric_space, 1.0 - t), -2.0);
      ref_matrix_eig(diag_system, i) *= enlarge;
    }
    RSS(ref_matrix_form_m(diag_system, limit_metric), "reform limit");

    if (REF_SUCCESS == ref_matrix_intersect(&(metric_orig[6 * node1]),
                                            limit_metric, limited)) {
      RSS(ref_matrix_intersect(&(metric[6 * node1]), limited,
                               &(metric[6 * node1])),
          "update m1");
    } else {
      ref_node_location(ref_node, node1);
      printf("dist %24.15e ratio %24.15e\n", dist, ratio);
      printf("RECOVER ref_metric_mixed_space_gradation\n");
    }
  }

  ref_free(metric_orig);

  ref_edge_free(ref_edge);

  RSS(ref_node_ghost_dbl(ref_grid_node(ref_grid), metric, 6), "update ghosts");

  return REF_SUCCESS;
}